

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config_global.c
# Opt level: O1

int configRemove(mpt_config *cfg,mpt_path *path)

{
  mpt_metatype *pmVar1;
  mpt_node *pmVar2;
  int iVar3;
  mpt_path p;
  mpt_node local_58;
  
  if (nodeGlobal == (mpt_node *)0x0) {
    return -4;
  }
  if (cfg[3]._vptr == (_mpt_vptr_config *)0x0) {
    if (path == (mpt_path *)0x0) {
      return -4;
    }
    pmVar2 = nodeGlobal;
    if (path->len == 0) {
      local_58.prev = (mpt_node *)0x0;
      local_58.parent = (mpt_node *)0x0;
      local_58._meta = (mpt_metatype *)0x0;
      local_58.next = (mpt_node *)0x0;
      local_58.ident._base = (char *)0x0;
      local_58.ident._len = 0;
      local_58.ident._charset = '\0';
      local_58.ident._max = '\f';
      local_58.ident._val[0] = '\0';
      local_58.ident._val[1] = '\0';
      local_58.ident._val[2] = '\0';
      local_58.ident._val[3] = '\0';
      local_58.children = nodeGlobal;
      mpt_node_clear(&local_58);
      nodeGlobal = (mpt_node *)0x0;
      return 0;
    }
  }
  else {
    local_58._meta = (mpt_metatype *)cfg[1]._vptr;
    local_58.next = (mpt_node *)cfg[2]._vptr;
    local_58.prev = (mpt_node *)cfg[3]._vptr;
    local_58.parent = (mpt_node *)cfg[4]._vptr;
    pmVar2 = mpt_node_query(nodeGlobal,(mpt_path *)&local_58);
    if (pmVar2 == (mpt_node *)0x0) {
      return 0;
    }
    if (local_58.prev != (mpt_node *)0x0) {
      return 0;
    }
    if (path == (mpt_path *)0x0) {
      pmVar1 = pmVar2->_meta;
      if (pmVar1 == (mpt_metatype *)0x0) {
        return 0;
      }
      (*pmVar1->_vptr->unref)(pmVar1);
      pmVar2->_meta = (mpt_metatype *)0x0;
      return 0;
    }
    if (path->len == 0) {
      mpt_node_clear(pmVar2);
      return 0;
    }
    pmVar2 = pmVar2->children;
  }
  local_58._meta = (mpt_metatype *)path->base;
  local_58.next = (mpt_node *)path->off;
  local_58.prev = (mpt_node *)path->len;
  local_58.parent = *(mpt_node **)&path->first;
  pmVar2 = mpt_node_query(pmVar2,(mpt_path *)&local_58);
  iVar3 = 0;
  if ((pmVar2 != (mpt_node *)0x0) && (iVar3 = 0, local_58.prev == (mpt_node *)0x0)) {
    if (pmVar2 == nodeGlobal) {
      nodeGlobal = pmVar2->next;
      pmVar2->next = (mpt_node *)0x0;
    }
    else {
      mpt_node_unlink(pmVar2);
    }
    mpt_node_destroy(pmVar2);
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

static int configRemove(MPT_INTERFACE(config) *cfg, const MPT_STRUCT(path) *path)
{
	MPT_STRUCT(configRoot) *c = MPT_baseaddr(configRoot, cfg, _cfg);
	MPT_STRUCT(path) p;
	MPT_STRUCT(node) *b;
	
	if (!(b = nodeGlobal)) {
		return MPT_ERROR(BadOperation);
	}
	/* get top level node */
	if (c->base.len) {
		p = c->base;
		if (!(b = mpt_node_query(b, &p))
		    || p.len) {
			return 0;
		}
		if (!path) {
			MPT_INTERFACE(metatype) *mt;
			if ((mt = b->_meta)) {
				mt->_vptr->unref(mt);
				b->_meta = 0;
			}
			return 0;
		}
		if (!path->len) {
			mpt_node_clear(b);
			return 0;
		}
		b = b->children;
	}
	/* no generic top element */
	else if (!path) {
		return MPT_ERROR(BadOperation);
	}
	/* clear global config */
	else if (!path->len) {
		clear_global();
		return 0;
	}
	p = *path;
	if (!(b = mpt_node_query(b, &p))
	    || p.len) {
		return 0;
	}
	if (b == nodeGlobal) {
		nodeGlobal = b->next;
		b->next = 0;
	} else {
		mpt_node_unlink(b);
	}
	mpt_node_destroy(b);
	return 1;
}